

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall mp::NLSolver::DestroyAutoStub(NLSolver *this)

{
  bool bVar1;
  long lVar2;
  NLUtils *pNVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  NLSolver *in_RDI;
  error_code ec;
  path *in_stack_ffffffffffffff60;
  path *this_00;
  string local_70 [39];
  format in_stack_ffffffffffffffb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  path *in_stack_ffffffffffffffc0;
  error_code local_18;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::error_code::error_code((error_code *)in_stack_ffffffffffffff60);
    this_00 = (path *)&stack0xffffffffffffffc0;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7);
    std::filesystem::remove_all(this_00,&local_18);
    std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffff60);
    bVar1 = std::error_code::operator_cast_to_bool(&local_18);
    if (bVar1) {
      pNVar3 = Utils(in_RDI);
      uVar4 = std::__cxx11::string::c_str();
      std::error_code::message_abi_cxx11_((error_code *)this_00);
      uVar5 = std::__cxx11::string::c_str();
      (*pNVar3->_vptr_NLUtils[4])(pNVar3,"Failed to remove temp dir \'%s\': %s",uVar4,uVar5);
      std::__cxx11::string::~string(local_70);
    }
  }
  return;
}

Assistant:

void NLSolver::DestroyAutoStub() {
  // delete temp folder if created
  if (pathstr_.size()) {
    std::error_code ec;
    std::filesystem::remove_all(pathstr_, ec);
    if (ec)
      Utils().log_warning("Failed to remove temp dir '%s': %s",
                          pathstr_.c_str(), ec.message().c_str());
  }
}